

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_nim.cpp
# Opt level: O0

Status __thiscall
flatbuffers::anon_unknown_0::NimBfbsGenerator::GenerateFromSchema
          (NimBfbsGenerator *this,Schema *schema,CodeGenOptions *options)

{
  Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int> *enums;
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *objects;
  anon_class_8_1_8991fb9c local_80;
  function<void_(const_reflection::Object_*)> local_78;
  anon_class_8_1_8991fb9c local_48;
  function<void_(const_reflection::Enum_*)> local_40;
  CodeGenOptions *local_20;
  CodeGenOptions *options_local;
  Schema *schema_local;
  NimBfbsGenerator *this_local;
  
  local_20 = options;
  options_local = (CodeGenOptions *)schema;
  schema_local = (Schema *)this;
  CodeGenOptions::operator=(&this->options_,options);
  enums = reflection::Schema::enums((Schema *)options_local);
  local_48.this = this;
  std::function<void(reflection::Enum_const*)>::
  function<flatbuffers::(anonymous_namespace)::NimBfbsGenerator::GenerateFromSchema(reflection::Schema_const*,flatbuffers::CodeGenOptions_const&)::_lambda(reflection::Enum_const*)_1_,void>
            ((function<void(reflection::Enum_const*)> *)&local_40,&local_48);
  ForAllEnums(enums,&local_40);
  std::function<void_(const_reflection::Enum_*)>::~function(&local_40);
  objects = reflection::Schema::objects((Schema *)options_local);
  local_80.this = this;
  std::function<void(reflection::Object_const*)>::
  function<flatbuffers::(anonymous_namespace)::NimBfbsGenerator::GenerateFromSchema(reflection::Schema_const*,flatbuffers::CodeGenOptions_const&)::_lambda(reflection::Object_const*)_1_,void>
            ((function<void(reflection::Object_const*)> *)&local_78,&local_80);
  ForAllObjects(objects,&local_78);
  std::function<void_(const_reflection::Object_*)>::~function(&local_78);
  return OK;
}

Assistant:

Status GenerateFromSchema(const r::Schema *schema,
                            const CodeGenOptions &options)
      FLATBUFFERS_OVERRIDE {
    options_ = options;
    ForAllEnums(schema->enums(), [&](const r::Enum *enum_def) {
      StartCodeBlock(enum_def);
      GenerateEnum(enum_def);
    });
    ForAllObjects(schema->objects(), [&](const r::Object *object) {
      StartCodeBlock(object);
      GenerateObject(object);
    });
    return OK;
  }